

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::ArgumentsValue::expectArgs
          (ArgumentsValue *this,string *method_name,pair<unsigned_long,_unsigned_long> *pos_count,
          pair<unsigned_long,_unsigned_long> *kw_count)

{
  size_type sVar1;
  ostream *poVar2;
  runtime_error *this_00;
  ulong *in_RCX;
  ulong *in_RDX;
  string *in_RSI;
  vector<minja::Value,_std::allocator<minja::Value>_> *in_RDI;
  ostringstream out;
  string local_1c8 [48];
  ostringstream local_198 [376];
  ulong *local_20;
  ulong *local_18;
  string *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar1 = std::vector<minja::Value,_std::allocator<minja::Value>_>::size(in_RDI);
  if (*local_18 <= sVar1) {
    sVar1 = std::vector<minja::Value,_std::allocator<minja::Value>_>::size(in_RDI);
    if (sVar1 <= local_18[1]) {
      sVar1 = std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>_>_>
              ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>_>_>
                      *)(in_RDI + 1));
      if (*local_20 <= sVar1) {
        sVar1 = std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>_>_>
                ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>_>_>
                        *)(in_RDI + 1));
        if (sVar1 <= local_20[1]) {
          return;
        }
      }
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar2 = std::operator<<((ostream *)local_198,local_10);
  poVar2 = std::operator<<(poVar2," must have between ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_18);
  poVar2 = std::operator<<(poVar2," and ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18[1]);
  poVar2 = std::operator<<(poVar2," positional arguments and between ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_20);
  poVar2 = std::operator<<(poVar2," and ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20[1]);
  std::operator<<(poVar2," keyword arguments");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this_00,local_1c8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void expectArgs(const std::string & method_name, const std::pair<size_t, size_t> & pos_count, const std::pair<size_t, size_t> & kw_count) {
    if (args.size() < pos_count.first || args.size() > pos_count.second || kwargs.size() < kw_count.first || kwargs.size() > kw_count.second) {
      std::ostringstream out;
      out << method_name << " must have between " << pos_count.first << " and " << pos_count.second << " positional arguments and between " << kw_count.first << " and " << kw_count.second << " keyword arguments";
      throw std::runtime_error(out.str());
    }
  }